

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_encoder.c
# Opt level: O0

lzma_ret lzma_simple_props_encode(void *options,uint8_t *out)

{
  lzma_options_bcj *opt;
  uint8_t *out_local;
  void *options_local;
  
  if ((options != (void *)0x0) && (*options != 0)) {
    write32ne(out,*options);
  }
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_simple_props_encode(const void *options, uint8_t *out)
{
	const lzma_options_bcj *const opt = options;

	// The default start offset is zero, so we don't need to store any
	// options unless the start offset is non-zero.
	if (opt == NULL || opt->start_offset == 0)
		return LZMA_OK;

	write32le(out, opt->start_offset);

	return LZMA_OK;
}